

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::dupPayload(Value *this,Value *other)

{
  bool bVar1;
  ValueType VVar2;
  char *pcVar3;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  char *local_28;
  char *str;
  Value *pVStack_18;
  uint len;
  Value *other_local;
  Value *this_local;
  
  pVStack_18 = other;
  other_local = this;
  VVar2 = type(other);
  setType(this,VVar2);
  setIsAllocated(this,false);
  VVar2 = type(this);
  if (realValue < VVar2) {
    if (VVar2 == stringValue) {
      if (((pVStack_18->value_).int_ != 0) && (bVar1 = isAllocated(pVStack_18), bVar1)) {
        bVar1 = isAllocated(pVStack_18);
        decodePrefixedString(bVar1,(pVStack_18->value_).string_,(uint *)((long)&str + 4),&local_28);
        pcVar3 = duplicateAndPrefixStringValue(local_28,str._4_4_);
        (this->value_).string_ = pcVar3;
        setIsAllocated(this,true);
        return;
      }
      this->value_ = pVStack_18->value_;
      return;
    }
    if (VVar2 != booleanValue) {
      if (VVar2 - arrayValue < 2) {
        this_00 = (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                   *)operator_new(0x30);
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::map(this_00,(pVStack_18->value_).map_);
        (this->value_).map_ = this_00;
        return;
      }
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                    ,0x3ec,"void Json::Value::dupPayload(const Value &)");
    }
  }
  this->value_ = pVStack_18->value_;
  return;
}

Assistant:

void Value::dupPayload(const Value& other) {
  setType(other.type());
  setIsAllocated(false);
  switch (type()) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    value_ = other.value_;
    break;
  case stringValue:
    if (other.value_.string_ && other.isAllocated()) {
      unsigned len;
      char const* str;
      decodePrefixedString(other.isAllocated(), other.value_.string_, &len,
                           &str);
      value_.string_ = duplicateAndPrefixStringValue(str, len);
      setIsAllocated(true);
    } else {
      value_.string_ = other.value_.string_;
    }
    break;
  case arrayValue:
  case objectValue:
    value_.map_ = new ObjectValues(*other.value_.map_);
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }
}